

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeAtomicNotify
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Address offset,Name mem)

{
  Name memory;
  AtomicNotify *pAVar1;
  bool bVar2;
  Ok local_e9;
  IRBuilder *local_e8;
  size_t local_e0;
  char *local_d8;
  uint local_cc;
  Err local_c8;
  Err *local_98;
  Err *err;
  Result<wasm::Ok> _val;
  AtomicNotify curr;
  IRBuilder *this_local;
  Name mem_local;
  Address offset_local;
  
  mem_local.super_IString.str._M_len = mem.super_IString.str._M_str;
  this_local = mem.super_IString.str._M_len;
  pAVar1 = (AtomicNotify *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.memory.super_IString.str._M_str = (char *)this;
  mem_local.super_IString.str._M_str = (char *)offset.addr;
  AtomicNotify::AtomicNotify(pAVar1);
  wasm::Name::operator=((Name *)&curr.notifyCount,(Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitAtomicNotify
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pAVar1);
  local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_98 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_c8,local_98);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_c8);
    wasm::Err::~Err(&local_c8);
  }
  local_cc = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_cc == 0) {
    local_d8 = mem_local.super_IString.str._M_str;
    local_e8 = this_local;
    local_e0 = mem_local.super_IString.str._M_len;
    memory.super_IString.str._M_str = (char *)mem_local.super_IString.str._M_len;
    memory.super_IString.str._M_len = (size_t)this_local;
    pAVar1 = Builder::makeAtomicNotify
                       (&this->builder,(Expression *)curr.offset.addr,curr.ptr,
                        (Address)mem_local.super_IString.str._M_str,memory);
    push(this,(Expression *)pAVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_e9);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeAtomicNotify(Address offset, Name mem) {
  AtomicNotify curr;
  curr.memory = mem;
  CHECK_ERR(visitAtomicNotify(&curr));
  push(builder.makeAtomicNotify(curr.ptr, curr.notifyCount, offset, mem));
  return Ok{};
}